

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJs.cpp
# Opt level: O0

bool Js::AsmJSCompiler::CheckFunctionHead(AsmJsModuleCompiler *m,ParseNode *fn,bool isGlobal)

{
  bool bVar1;
  ParseNodeFnc *this;
  ParseNodeFnc *fnc;
  bool isGlobal_local;
  ParseNode *fn_local;
  AsmJsModuleCompiler *m_local;
  
  this = ParseNode::AsParseNodeFnc(fn);
  bVar1 = ParseNodeFnc::HasNonSimpleParameterList(this);
  if (bVar1) {
    m_local._7_1_ =
         AsmJsModuleCompiler::Fail(m,fn,L"default, rest & destructuring args not allowed");
  }
  else {
    bVar1 = ParseNodeFnc::IsStaticMember(this);
    if (bVar1) {
      m_local._7_1_ = AsmJsModuleCompiler::Fail(m,fn,L"static functions are not allowed");
    }
    else {
      bVar1 = ParseNodeFnc::IsGenerator(this);
      if (bVar1) {
        m_local._7_1_ = AsmJsModuleCompiler::Fail(m,fn,L"generator functions are not allowed");
      }
      else {
        bVar1 = ParseNodeFnc::IsAsync(this);
        if (bVar1) {
          m_local._7_1_ = AsmJsModuleCompiler::Fail(m,fn,L"async functions are not allowed");
        }
        else {
          bVar1 = ParseNodeFnc::IsLambda(this);
          if (bVar1) {
            m_local._7_1_ = AsmJsModuleCompiler::Fail(m,fn,L"lambda functions are not allowed");
          }
          else if ((isGlobal) || (this->nestedCount == 0)) {
            bVar1 = ParseNodeFnc::IsAsmJsAllowed(this);
            if (bVar1) {
              m_local._7_1_ = true;
            }
            else {
              m_local._7_1_ = AsmJsModuleCompiler::Fail(m,fn,L"invalid function flags detected");
            }
          }
          else {
            m_local._7_1_ = AsmJsModuleCompiler::Fail(m,fn,L"closure functions are not allowed");
          }
        }
      }
    }
  }
  return m_local._7_1_;
}

Assistant:

bool
    AsmJSCompiler::CheckFunctionHead(AsmJsModuleCompiler &m, ParseNode *fn, bool isGlobal /*= true*/)
    {
        ParseNodeFnc * fnc = fn->AsParseNodeFnc();

        if (fnc->HasNonSimpleParameterList())
        {
            return m.Fail(fn, _u("default, rest & destructuring args not allowed"));
        }

        if (fnc->IsStaticMember())
        {
            return m.Fail(fn, _u("static functions are not allowed"));
        }

        if (fnc->IsGenerator())
        {
            return m.Fail(fn, _u("generator functions are not allowed"));
        }

        if (fnc->IsAsync())
        {
            return m.Fail(fn, _u("async functions are not allowed"));
        }

        if (fnc->IsLambda())
        {
            return m.Fail(fn, _u("lambda functions are not allowed"));
        }

        if (!isGlobal && fnc->nestedCount != 0)
        {
            return m.Fail(fn, _u("closure functions are not allowed"));
        }

        if (!fnc->IsAsmJsAllowed())
        {
            return m.Fail(fn, _u("invalid function flags detected"));
        }

        return true;
    }